

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_lattice.c
# Opt level: O2

ps_lattice_t * ps_lattice_read(ps_decoder_t *ps,char *file)

{
  float64 fVar1;
  int iVar2;
  uint uVar3;
  int32 iVar4;
  s3wid_t sVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  ps_lattice_t *dag;
  dict_t *pdVar9;
  logmath_t *plVar10;
  long lVar11;
  listelem_alloc_t *plVar12;
  FILE *fh;
  lineiter_t *li;
  void *ptr;
  char *pcVar13;
  ps_latnode_t *ppVar14;
  char *fmt;
  ps_latnode_s **pppVar15;
  double dVar16;
  int sf;
  int seqid;
  float local_174;
  char *local_170;
  FILE *local_168;
  int32 ispipe;
  float64 lb;
  double local_150;
  uint local_144;
  int lef;
  int fef;
  char wd [256];
  
  dag = (ps_lattice_t *)
        __ckd_calloc__(1,0x80,
                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                       ,0x192);
  if (ps == (ps_decoder_t *)0x0) {
    pdVar9 = dict_init((ps_config_t *)0x0,(bin_mdef_t *)0x0);
    dag->dict = pdVar9;
    plVar10 = logmath_init(1.0001,0,0);
    dag->lmath = plVar10;
    iVar4 = 100;
  }
  else {
    dag->search = ps->search;
    pdVar9 = dict_retain(ps->dict);
    dag->dict = pdVar9;
    plVar10 = logmath_retain(ps->lmath);
    dag->lmath = plVar10;
    lVar11 = ps_config_int(dag->search->config,"frate");
    iVar4 = (int32)lVar11;
  }
  dag->frate = iVar4;
  dag->silence = dag->dict->silwid;
  plVar12 = listelem_alloc_init(0x48);
  dag->latnode_alloc = plVar12;
  plVar12 = listelem_alloc_init(0x30);
  dag->latlink_alloc = plVar12;
  plVar12 = listelem_alloc_init(0x10);
  dag->latlink_list_alloc = plVar12;
  dag->refcount = 1;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
          ,0x1a7,"Reading DAG file: %s\n",file);
  fh = fopen_compchk(file,&ispipe);
  if (fh == (FILE *)0x0) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                   ,0x1a9,"Failed to open DAG file \'%s\' for reading",file);
    return (ps_lattice_t *)0x0;
  }
  li = lineiter_start(fh);
  if (li == (lineiter_t *)0x0) {
    lVar11 = 0x1b0;
LAB_00110d39:
    ptr = (void *)0x0;
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
            ,lVar11,"Premature EOF(%s)\n",file);
    li = (lineiter_t *)0x0;
    goto LAB_00110d46;
  }
  pcVar13 = li->buf;
  iVar2 = strncmp(pcVar13,"# getcwd: ",10);
  if (iVar2 != 0) {
    ptr = (void *)0x0;
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
            ,0x1b4,"%s does not begin with \'# getcwd: \'\n%s",file,pcVar13);
    goto LAB_00110d46;
  }
  li = lineiter_next(li);
  if (li == (lineiter_t *)0x0) {
    lVar11 = 0x1b8;
    goto LAB_00110d39;
  }
  pcVar13 = li->buf;
  iVar2 = strncmp(pcVar13,"# -logbase ",0xb);
  if ((iVar2 != 0) || (iVar2 = __isoc99_sscanf(pcVar13 + 0xb,"%lf",&lb), iVar2 != 1)) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
            ,0x1bd,"%s: Cannot find -logbase in header\n",file);
    lb = 1.0001;
  }
  if (dag->lmath == (logmath_t *)0x0) {
    plVar10 = logmath_init(lb,0,1);
    dag->lmath = plVar10;
LAB_00110efa:
    local_174 = 1.0;
  }
  else {
    fVar1 = logmath_get_base(dag->lmath);
    if (ABS((double)lb - (double)(float)(double)fVar1) < 0.0001) goto LAB_00110efa;
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
            ,0x1c6,"Inconsistent logbases: %f vs %f: will compensate\n");
    local_150 = log((double)lb);
    dVar16 = log((double)(float)(double)fVar1);
    local_174 = (float)(local_150 / dVar16);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
            ,0x1c8,"Lattice log ratio: %f\n",SUB84((double)local_174,0));
  }
  iVar2 = dag_param_read(li,"Frames");
  dag->n_frames = iVar2;
  if (iVar2 < 1) {
    pcVar13 = "Frames parameter missing or invalid\n";
    lVar11 = 0x1ce;
  }
  else {
    uVar3 = dag_param_read(li,"Nodes");
    if (0 < (int)uVar3) {
      local_150 = (double)(ulong)uVar3;
      local_170 = file;
      local_168 = fh;
      local_144 = uVar3;
      ptr = __ckd_calloc__((size_t)local_150,8,
                           "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                           ,0x1d9);
      pppVar15 = &dag->nodes;
      for (dVar16 = 0.0; local_150 != dVar16; dVar16 = (double)((long)dVar16 + 1)) {
        li = lineiter_next(li);
        file = local_170;
        if (li == (lineiter_t *)0x0) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                  ,0x1e2,"Premature EOF while loading Nodes(%s)\n",local_170);
          fh = local_168;
          goto LAB_00110d46;
        }
        uVar3 = __isoc99_sscanf(li->buf,"%d %255s %d %d %d",&seqid,wd,&sf,&fef,&lef);
        if (uVar3 != 5) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                  ,0x1e9,"Cannot parse line: %s, value of count %d\n",li->buf,(ulong)uVar3);
          file = local_170;
          fh = local_168;
          goto LAB_00110d46;
        }
        uVar3 = dict_wordid(dag->dict,wd);
        if ((int)uVar3 < 0) {
          if (dag->search == (ps_search_t *)0x0) {
            pcVar13 = __ckd_salloc__(wd,
                                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                                     ,0x1f0);
            iVar4 = dict_word2basestr(pcVar13);
            if ((iVar4 != -1) && (sVar5 = dict_wordid(dag->dict,pcVar13), sVar5 == -1)) {
              dict_add_word(dag->dict,pcVar13,(s3cipid_t *)0x0,0);
            }
            ckd_free(pcVar13);
            uVar3 = dict_add_word(dag->dict,wd,(s3cipid_t *)0x0,0);
            if (-1 < (int)uVar3) goto LAB_00111050;
          }
          pcVar13 = li->buf;
          fmt = "Unknown word in line: %s\n";
          lVar11 = 0x1f9;
LAB_00111258:
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                  ,lVar11,fmt,pcVar13);
          file = local_170;
          fh = local_168;
          goto LAB_00110d46;
        }
LAB_00111050:
        if (dVar16 != (double)(ulong)(uint)seqid) {
          pcVar13 = li->buf;
          fmt = "Seqno error: %s\n";
          lVar11 = 0x1ff;
          goto LAB_00111258;
        }
        ppVar14 = (ps_latnode_t *)
                  __listelem_malloc__(dag->latnode_alloc,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                                      ,0x203);
        *pppVar15 = ppVar14;
        *(ps_latnode_t **)((long)ptr + (long)dVar16 * 8) = ppVar14;
        ppVar14->wid = uVar3;
        ppVar14->basewid = dag->dict->word[uVar3].basewid;
        ppVar14->id = seqid;
        ppVar14->sf = sf;
        ppVar14->fef = fef;
        ppVar14->lef = lef;
        ppVar14->reachable = 0;
        ppVar14->next = (ps_latnode_s *)0x0;
        pppVar15 = &ppVar14->next;
        ppVar14->exits = (latlink_list_t *)0x0;
        ppVar14->entries = (latlink_list_t *)0x0;
      }
      uVar6 = dag_param_read(li,"Initial");
      uVar3 = local_144;
      if (local_144 <= uVar6) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                ,0x215,"Initial node parameter missing or invalid\n");
        file = local_170;
        fh = local_168;
        goto LAB_00110d46;
      }
      dag->start = *(ps_latnode_t **)((long)ptr + (ulong)uVar6 * 8);
      uVar6 = dag_param_read(li,"Final");
      fh = local_168;
      file = local_170;
      if (uVar3 <= uVar6) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                ,0x21d,"Final node parameter missing or invalid\n");
        goto LAB_00110d46;
      }
      dag->end = *(ps_latnode_t **)((long)ptr + (ulong)uVar6 * 8);
      iVar2 = dag_param_read(li,"BestSegAscr");
      if (-1 < iVar2) {
        iVar2 = iVar2 + 1;
        do {
          iVar2 = iVar2 + -1;
          if (iVar2 == 0) goto LAB_001112d5;
          li = lineiter_next(li);
        } while (li != (lineiter_t *)0x0);
        li = (lineiter_t *)0x0;
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
                ,0x22a,"Premature EOF while (%s) ignoring BestSegAscr\n",0);
        goto LAB_00110d46;
      }
      pcVar13 = "BestSegAscr parameter missing\n";
      lVar11 = 0x224;
      goto LAB_001113de;
    }
    pcVar13 = "Nodes parameter missing or invalid\n";
    lVar11 = 0x1d4;
  }
  ptr = (void *)0x0;
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
          ,lVar11,pcVar13);
  goto LAB_00110d46;
  while ((*li->buf == '#' || (iVar2 = strncmp(li->buf,"Edges",5), iVar2 != 0))) {
LAB_001112d5:
    li = lineiter_next(li);
    if (li == (lineiter_t *)0x0) {
      pcVar13 = "Edges missing\n";
      li = (lineiter_t *)0x0;
      lVar11 = 0x237;
      goto LAB_001113de;
    }
  }
  while ((li = lineiter_next(li), li != (lineiter_t *)0x0 &&
         (iVar2 = __isoc99_sscanf(li->buf,"%d %d %d",wd,&seqid,&sf), iVar2 == 3))) {
    if (-0x20000001 < sf) {
      if ((local_174 != 1.0) || (NAN(local_174))) {
        sf = (int)((float)sf * local_174);
      }
      ppVar14 = *(ps_latnode_t **)((long)ptr + (long)seqid * 8);
      ps_lattice_link(dag,*(ps_latnode_t **)((long)ptr + (long)(int)wd._0_4_ * 8),ppVar14,sf,
                      ppVar14->sf + -1);
    }
  }
  iVar2 = strcmp(li->buf,"End\n");
  if (iVar2 == 0) {
    lineiter_free(li);
    fclose_comp(fh,ispipe);
    ckd_free(ptr);
    iVar2 = dict_filler_word(dag->dict,dag->end->wid);
    if (iVar2 == 0) {
      ppVar14 = dag->end;
    }
    else {
      if (dag->search == (ps_search_t *)0x0) {
        sVar5 = dict_wordid(dag->dict,"</s>");
      }
      else {
        sVar5 = dag->search->finish_wid;
      }
      ppVar14 = dag->end;
      ppVar14->basewid = sVar5;
    }
    dag_mark_reachable(ppVar14);
    ps_lattice_delete_unreachable(dag);
    if (ps == (ps_decoder_t *)0x0) {
      return dag;
    }
    plVar10 = dag->lmath;
    dVar16 = ps_config_float(ps->config,"pip");
    iVar2 = logmath_log(plVar10,(float64)dVar16);
    plVar10 = dag->lmath;
    dVar16 = ps_config_float(ps->config,"silprob");
    iVar7 = logmath_log(plVar10,(float64)dVar16);
    plVar10 = dag->lmath;
    dVar16 = ps_config_float(ps->config,"fillprob");
    iVar8 = logmath_log(plVar10,(float64)dVar16);
    ps_lattice_penalize_fillers(dag,iVar7 + iVar2,iVar2 + iVar8);
    return dag;
  }
  pcVar13 = "Terminating \'End\' missing\n";
  lVar11 = 0x24a;
LAB_001113de:
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
          ,lVar11,pcVar13);
LAB_00110d46:
  err_msg(ERR_ERROR,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/ps_lattice.c"
          ,0x26f,"Failed to load %s\n",file);
  lineiter_free(li);
  fclose_comp(fh,ispipe);
  ckd_free(ptr);
  return (ps_lattice_t *)0x0;
}

Assistant:

ps_lattice_t *
ps_lattice_read(ps_decoder_t *ps,
                char const *file)
{
    FILE *fp;
    int32 ispipe;
    lineiter_t *line;
    float64 lb;
    float32 logratio;
    ps_latnode_t **darray;
    ps_lattice_t *dag;
    int i, k, n_nodes;
    int32 pip, silpen, fillpen;
    ps_latnode_t **pnodes;

    dag = ckd_calloc(1, sizeof(*dag));

    if (ps) {
        dag->search = ps->search;
        dag->dict = dict_retain(ps->dict);
        dag->lmath = logmath_retain(ps->lmath);
        dag->frate = ps_config_int(dag->search->config, "frate");
    }
    else {
        dag->dict = dict_init(NULL, NULL);
        dag->lmath = logmath_init(1.0001, 0, FALSE);
        dag->frate = 100;
    }
    dag->silence = dict_silwid(dag->dict);
    dag->latnode_alloc = listelem_alloc_init(sizeof(ps_latnode_t));
    dag->latlink_alloc = listelem_alloc_init(sizeof(ps_latlink_t));
    dag->latlink_list_alloc = listelem_alloc_init(sizeof(latlink_list_t));
    dag->refcount = 1;

    darray = NULL;

    E_INFO("Reading DAG file: %s\n", file);
    if ((fp = fopen_compchk(file, &ispipe)) == NULL) {
        E_ERROR_SYSTEM("Failed to open DAG file '%s' for reading", file);
        return NULL;
    }
    line = lineiter_start(fp);

    /* Read and verify logbase (ONE BIG HACK!!) */
    if (line == NULL) {
        E_ERROR("Premature EOF(%s)\n", file);
        goto load_error;
    }
    if (strncmp(line->buf, "# getcwd: ", 10) != 0) {
        E_ERROR("%s does not begin with '# getcwd: '\n%s", file, line->buf);
        goto load_error;
    }
    if ((line = lineiter_next(line)) == NULL) {
        E_ERROR("Premature EOF(%s)\n", file);
        goto load_error;
    }
    if ((strncmp(line->buf, "# -logbase ", 11) != 0)
        || (sscanf(line->buf + 11, "%lf", &lb) != 1)) {
        E_WARN("%s: Cannot find -logbase in header\n", file);
        lb = 1.0001;
    }
    logratio = 1.0f;
    if (dag->lmath == NULL)
        dag->lmath = logmath_init(lb, 0, TRUE);
    else {
        float32 pb = logmath_get_base(dag->lmath);
        if (fabs(lb - pb) >= 0.0001) {
            E_WARN("Inconsistent logbases: %f vs %f: will compensate\n", lb, pb);
            logratio = (float32)(log(lb) / log(pb));
            E_INFO("Lattice log ratio: %f\n", logratio);
        }
    }
    /* Read Frames parameter */
    dag->n_frames = dag_param_read(line, "Frames");
    if (dag->n_frames <= 0) {
        E_ERROR("Frames parameter missing or invalid\n");
        goto load_error;
    }
    /* Read Nodes parameter */
    n_nodes = dag_param_read(line, "Nodes");
    if (n_nodes <= 0) {
        E_ERROR("Nodes parameter missing or invalid\n");
        goto load_error;
    }

    /* Read nodes */
    darray = ckd_calloc(n_nodes, sizeof(*darray));
    pnodes = &dag->nodes;
    for (i = 0; i < n_nodes; i++) {
        int32 w;
        int seqid, sf, fef, lef;
        char wd[256];
        ps_latnode_t *node;

        if ((line = lineiter_next(line)) == NULL) {
            E_ERROR("Premature EOF while loading Nodes(%s)\n", file);
            goto load_error;
        }

        if ((k =
             sscanf(line->buf, "%d %255s %d %d %d", &seqid, wd, &sf, &fef,
                    &lef)) != 5) {
            E_ERROR("Cannot parse line: %s, value of count %d\n", line->buf, k);
            goto load_error;
        }

        w = dict_wordid(dag->dict, wd);
        if (w < 0) {
            if (dag->search == NULL) {
                char *ww = ckd_salloc(wd);
                if (dict_word2basestr(ww) != -1) {
                    if (dict_wordid(dag->dict, ww) == BAD_S3WID)
                        dict_add_word(dag->dict, ww, NULL, 0);
                }
                ckd_free(ww);
                w = dict_add_word(dag->dict, wd, NULL, 0);
            }
            if (w < 0) {
                E_ERROR("Unknown word in line: %s\n", line->buf);
                goto load_error;
            }
        }

        if (seqid != i) {
            E_ERROR("Seqno error: %s\n", line->buf);
            goto load_error;
        }

        *pnodes = listelem_malloc(dag->latnode_alloc);
        node = *pnodes;
        darray[i] = node;
        node->wid = w;
        node->basewid = dict_basewid(dag->dict, w);
        node->id = seqid;
        node->sf = sf;
        node->fef = fef;
        node->lef = lef;
        node->reachable = 0;
        node->exits = node->entries = NULL;
        node->next = NULL;
        pnodes = &node->next;
    }

    /* Read initial node ID */
    k = dag_param_read(line, "Initial");
    if ((k < 0) || (k >= n_nodes)) {
        E_ERROR("Initial node parameter missing or invalid\n");
        goto load_error;
    }
    dag->start = darray[k];

    /* Read final node ID */
    k = dag_param_read(line, "Final");
    if ((k < 0) || (k >= n_nodes)) {
        E_ERROR("Final node parameter missing or invalid\n");
        goto load_error;
    }
    dag->end = darray[k];

    /* Read bestsegscore entries and ignore them. */
    if ((k = dag_param_read(line, "BestSegAscr")) < 0) {
        E_ERROR("BestSegAscr parameter missing\n");
        goto load_error;
    }
    for (i = 0; i < k; i++) {
        if ((line = lineiter_next(line)) == NULL) {
            E_ERROR("Premature EOF while (%s) ignoring BestSegAscr\n",
                    line);
            goto load_error;
        }
    }

    /* Read in edges. */
    while ((line = lineiter_next(line)) != NULL) {
        if (line->buf[0] == '#')
            continue;
        if (0 == strncmp(line->buf, "Edges", 5))
            break;
    }
    if (line == NULL) {
        E_ERROR("Edges missing\n");
        goto load_error;
    }
    while ((line = lineiter_next(line)) != NULL) {
        int from, to, ascr;
        ps_latnode_t *pd, *d;

        if (sscanf(line->buf, "%d %d %d", &from, &to, &ascr) != 3)
            break;
        if (ascr WORSE_THAN WORST_SCORE)
            continue;
        pd = darray[from];
        d = darray[to];
        if (logratio != 1.0f)
            /* FIXME: possible under/overflow!!! */
            ascr = (int32)(ascr * logratio);
        ps_lattice_link(dag, pd, d, ascr, d->sf - 1);
    }
    if (strcmp(line->buf, "End\n") != 0) {
        E_ERROR("Terminating 'End' missing\n");
        goto load_error;
    }
    lineiter_free(line);
    fclose_comp(fp, ispipe);
    ckd_free(darray);

    /* Minor hack: If the final node is a filler word and not </s>,
     * then set its base word ID to </s>, so that the language model
     * scores won't be screwed up. */
    if (dict_filler_word(dag->dict, dag->end->wid))
        dag->end->basewid = dag->search
            ? ps_search_finish_wid(dag->search)
            : dict_wordid(dag->dict, S3_FINISH_WORD);

    /* Mark reachable from dag->end */
    dag_mark_reachable(dag->end);

    /* Free nodes unreachable from dag->end and their links */
    ps_lattice_delete_unreachable(dag);

    if (ps) {
        /* Build links around silence and filler words, since they do
         * not exist in the language model.  FIXME: This is
         * potentially buggy, as we already do this before outputting
         * lattices. */
        pip = logmath_log(dag->lmath, ps_config_float(ps->config, "pip"));
        silpen = pip + logmath_log(dag->lmath,
                                   ps_config_float(ps->config, "silprob"));
        fillpen = pip + logmath_log(dag->lmath,
                                    ps_config_float(ps->config, "fillprob"));
        ps_lattice_penalize_fillers(dag, silpen, fillpen);
    }

    return dag;

  load_error:
    E_ERROR("Failed to load %s\n", file);
    lineiter_free(line);
    fclose_comp(fp, ispipe);
    ckd_free(darray);
    return NULL;
}